

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_impl.cpp
# Opt level: O0

void ImGui_ImplGlfwGL3_Shutdown(void)

{
  int local_c;
  ImGuiMouseCursor cursor_n;
  
  for (local_c = 0; local_c < 7; local_c = local_c + 1) {
    glfwDestroyCursor(g_MouseCursors[local_c]);
  }
  memset(g_MouseCursors,0,0x38);
  ImGui_ImplGlfwGL3_InvalidateDeviceObjects();
  return;
}

Assistant:

void ImGui_ImplGlfwGL3_Shutdown()
{
    // Destroy GLFW mouse cursors
    for (ImGuiMouseCursor cursor_n = 0; cursor_n < ImGuiMouseCursor_COUNT; cursor_n++)
        glfwDestroyCursor(g_MouseCursors[cursor_n]);
    memset(g_MouseCursors, 0, sizeof(g_MouseCursors));

    // Destroy OpenGL objects
    ImGui_ImplGlfwGL3_InvalidateDeviceObjects();
}